

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unbuf.cc
# Opt level: O0

void __thiscall bsplib::Unbuf::Unbuf(Unbuf *this,size_t max_msg_size,MPI_Comm comm)

{
  MPI_Comm comm_local;
  size_t max_msg_size_local;
  Unbuf *this_local;
  
  this->m_pid = -1;
  this->m_nprocs = -1;
  this->m_comm = (MPI_Comm)&ompi_mpi_comm_null;
  this->m_max_msg_size = max_msg_size;
  std::vector<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::vector(&this->m_sends);
  std::vector<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::vector(&this->m_recvs);
  std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::vector(&this->m_reqs);
  std::vector<int,_std::allocator<int>_>::vector(&this->m_ready);
  MPI_Comm_dup(comm,&this->m_comm);
  MPI_Comm_size(this->m_comm,&this->m_nprocs);
  MPI_Comm_rank(this->m_comm);
  return;
}

Assistant:

Unbuf::Unbuf( size_t max_msg_size, MPI_Comm comm)
   : m_pid(-1), m_nprocs(-1)
   , m_comm(MPI_COMM_NULL)
   , m_max_msg_size( max_msg_size )
{
    MPI_Comm_dup( comm, &m_comm );
    MPI_Comm_size( m_comm, &m_nprocs );
    MPI_Comm_rank( m_comm, &m_pid );
}